

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O2

REF_STATUS ref_node_remove(REF_NODE ref_node,REF_INT node)

{
  uint uVar1;
  undefined8 in_RAX;
  long lVar2;
  ulong uVar3;
  undefined8 uVar4;
  long lVar5;
  char *pcVar6;
  REF_INT location;
  
  location = (REF_INT)((ulong)in_RAX >> 0x20);
  uVar1 = 3;
  if (((-1 < node) && (node < ref_node->max)) && (-1 < ref_node->global[(uint)node])) {
    uVar1 = ref_sort_search_glob
                      (ref_node->n,ref_node->sorted_global,ref_node->global[(uint)node],&location);
    if (uVar1 == 0) {
      uVar3 = (ulong)ref_node->n;
      lVar2 = (long)location;
      for (lVar5 = lVar2; lVar5 < (long)(uVar3 - 1); lVar5 = lVar5 + 1) {
        ref_node->sorted_global[lVar5] = ref_node->sorted_global[lVar5 + 1];
      }
      for (; lVar2 < (int)uVar3 + -1; lVar2 = lVar2 + 1) {
        ref_node->sorted_local[lVar2] = ref_node->sorted_local[lVar2 + 1];
        uVar3 = (ulong)(uint)ref_node->n;
      }
      uVar1 = ref_node_push_unused(ref_node,ref_node->global[(uint)node]);
      if (uVar1 == 0) {
        ref_node->global[(uint)node] = (long)ref_node->blank;
        ref_node->blank = -2 - node;
        ref_node->n = ref_node->n + -1;
        return 0;
      }
      pcVar6 = "store unused global";
      uVar4 = 0x1b4;
    }
    else {
      pcVar6 = "find global in sort list";
      uVar4 = 0x1a8;
    }
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar4,
           "ref_node_remove",(ulong)uVar1,pcVar6);
  }
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_node_remove(REF_NODE ref_node, REF_INT node) {
  REF_INT location, sorted_node;
  if (!ref_node_valid(ref_node, node)) return REF_INVALID;

  RSS(ref_sort_search_glob(ref_node_n(ref_node), ref_node->sorted_global,
                           ref_node->global[node], &location),
      "find global in sort list");

  for (sorted_node = location; sorted_node < ref_node_n(ref_node) - 1;
       sorted_node++)
    ref_node->sorted_global[sorted_node] =
        ref_node->sorted_global[sorted_node + 1];
  for (sorted_node = location; sorted_node < ref_node_n(ref_node) - 1;
       sorted_node++)
    ref_node->sorted_local[sorted_node] =
        ref_node->sorted_local[sorted_node + 1];

  RSS(ref_node_push_unused(ref_node, ref_node->global[node]),
      "store unused global");

  ref_node->global[node] = ref_node->blank;
  ref_node->blank = index2next(node);

  (ref_node->n)--;

  return REF_SUCCESS;
}